

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdiSubWindowPrivate::sizeParameters(QMdiSubWindowPrivate *this,int *margin,int *minWidth)

{
  bool bVar1;
  Int IVar2;
  undefined4 uVar3;
  int iVar4;
  QWidget *this_00;
  QStyle *pQVar5;
  int *in_RDX;
  undefined4 *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  int tempWidth;
  QMdiSubWindow *q;
  QRect rect;
  WindowFlags flags;
  QStyleOptionTitleBar opt;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffff48;
  int iVar7;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar8;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff78;
  QFlagsStorageHelper<Qt::WindowType,_4> local_80;
  QFlagsStorageHelper<Qt::WindowType,_4> local_7c;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func(in_RDI)->super_QWidget;
  local_7c.super_QFlagsStorage<Qt::WindowType>.i = (QFlagsStorage<Qt::WindowType>)0xaaaaaaaa;
  local_7c.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       QWidget::windowFlags
                 ((QWidget *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  uVar6 = true;
  if (*(long *)&(in_RDI->super_QWidgetPrivate).field_0x10 != 0) {
    local_80.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)CONCAT17(1,in_stack_ffffffffffffff40),
                    (WindowType)((ulong)in_RDI >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_80);
    uVar6 = IVar2 != 0;
  }
  if ((bool)uVar6 == false) {
    bVar1 = QWidget::isMaximized(this_00);
    if ((!bVar1) ||
       (bVar1 = drawTitleBarWhenMaximized
                          ((QMdiSubWindowPrivate *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)), bVar1)) {
      pQVar5 = QWidget::style((QWidget *)in_RDI);
      uVar3 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x2c,0,this_00);
      *in_RSI = uVar3;
    }
    else {
      *in_RSI = 0;
    }
    memset(local_78,0xaa,0x70);
    titleBarOptions(in_stack_ffffffffffffff78);
    iVar8 = 0;
    for (iVar7 = 0; iVar7 < 9; iVar7 = iVar7 + 1) {
      if (SubControls[iVar7] == SC_TitleBarLabel) {
        iVar8 = iVar8 + 0x1e;
      }
      else {
        pQVar5 = QWidget::style((QWidget *)in_RDI);
        (**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,5,local_78,SubControls[iVar7],this_00);
        bVar1 = QRect::isValid((QRect *)CONCAT17(uVar6,in_stack_ffffffffffffff40));
        if (bVar1) {
          iVar4 = QRect::width((QRect *)in_RDI);
          iVar8 = iVar4 + iVar8;
        }
      }
    }
    *in_RDX = iVar8;
    QStyleOptionTitleBar::~QStyleOptionTitleBar
              ((QStyleOptionTitleBar *)CONCAT17(uVar6,in_stack_ffffffffffffff40));
  }
  else {
    *in_RSI = 0;
    *in_RDX = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::sizeParameters(int *margin, int *minWidth) const
{
    Q_Q(const QMdiSubWindow);
    Qt::WindowFlags flags = q->windowFlags();
    if (!parent || flags & Qt::FramelessWindowHint) {
        *margin = 0;
        *minWidth = 0;
        return;
    }

    if (q->isMaximized() && !drawTitleBarWhenMaximized())
        *margin = 0;
    else
        *margin = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q);

    QStyleOptionTitleBar opt = this->titleBarOptions();
    int tempWidth = 0;
    for (int i = 0; i < NumSubControls; ++i) {
        if (SubControls[i] == QStyle::SC_TitleBarLabel) {
            tempWidth += 30;
            continue;
        }
        QRect rect = q->style()->subControlRect(QStyle::CC_TitleBar, &opt, SubControls[i], q);
        if (!rect.isValid())
            continue;
        tempWidth += rect.width();
    }
    *minWidth = tempWidth;
}